

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O0

void ocmesh::details::skipcomments(istream *stream)

{
  int iVar1;
  istream *stream_local;
  
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 != 0x23) break;
    skipwhile<ocmesh::details::skipcomments(std::istream&)::__0>(stream);
    skipwhile<int(*)(int)noexcept>(stream,isspace);
  }
  return;
}

Assistant:

void skipcomments(std::istream &stream) {
        while(stream.peek() == '#') {
            skipwhile(stream, [](char c) { return c != '\n'; });
            skipwhile(stream, isspace);
        }
    }